

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfBufferInline.h
# Opt level: O2

void sbfBuffer_destroy(sbfBuffer_conflict buffer)

{
  sbfRefCount *psVar1;
  
  LOCK();
  psVar1 = &buffer->mRefCount;
  psVar1->mRefCount = psVar1->mRefCount - 1;
  UNLOCK();
  if (psVar1->mRefCount != 0) {
    return;
  }
  if (buffer->mDestroyCb != (sbfBufferDestroyCb)0x0) {
    (*buffer->mDestroyCb)(buffer,buffer->mDestroyData,buffer->mDestroyClosure);
  }
  if (buffer->mAllocated != 0) {
    free(buffer);
    return;
  }
  sbfPool_put(buffer);
  return;
}

Assistant:

static SBF_INLINE void
sbfBuffer_destroy (sbfBuffer buffer)
{
    if (!sbfRefCount_decrement (&buffer->mRefCount))
        return;

    if (buffer->mDestroyCb != NULL)
    {
        buffer->mDestroyCb (buffer,
                            buffer->mDestroyData,
                            buffer->mDestroyClosure);
    }

    if (buffer->mAllocated)
#ifdef WIN32
        LocalFree (buffer);
#else
        free (buffer);
#endif
    else
        sbfPool_put (buffer);
}